

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

int uv__udp_recv_start(uv_udp_t *handle,uv_alloc_cb alloc_cb,uv_udp_recv_cb recv_cb)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  
  if (recv_cb == (uv_udp_recv_cb)0x0 || alloc_cb == (uv_alloc_cb)0x0) {
    return -0x16;
  }
  iVar3 = uv__io_active(&handle->io_watcher,1);
  if (iVar3 == 0) {
    iVar3 = uv__udp_maybe_deferred_bind(handle,2,0);
    if (iVar3 == 0) {
      handle->alloc_cb = alloc_cb;
      handle->recv_cb = recv_cb;
      uv__io_start(handle->loop,&handle->io_watcher,1);
      uVar2 = handle->flags;
      if (((uVar2 & 4) == 0) && (handle->flags = uVar2 | 4, (uVar2 & 8) != 0)) {
        puVar1 = &handle->loop->active_handles;
        *puVar1 = *puVar1 + 1;
      }
      iVar3 = 0;
    }
  }
  else {
    iVar3 = -0x72;
  }
  return iVar3;
}

Assistant:

int uv__udp_recv_start(uv_udp_t* handle,
                       uv_alloc_cb alloc_cb,
                       uv_udp_recv_cb recv_cb) {
  int err;

  if (alloc_cb == NULL || recv_cb == NULL)
    return UV_EINVAL;

  if (uv__io_active(&handle->io_watcher, POLLIN))
    return UV_EALREADY;  /* FIXME(bnoordhuis) Should be UV_EBUSY. */

  err = uv__udp_maybe_deferred_bind(handle, AF_INET, 0);
  if (err)
    return err;

  handle->alloc_cb = alloc_cb;
  handle->recv_cb = recv_cb;

  uv__io_start(handle->loop, &handle->io_watcher, POLLIN);
  uv__handle_start(handle);

  return 0;
}